

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_DEFB(Context *ctx)

{
  int regnum;
  ConstantsList *pCVar1;
  char *pcVar2;
  
  if (ctx->instruction_count == 0) {
    if ((ctx->dest_arg).regtype == REG_TYPE_CONSTBOOL) {
      regnum = (ctx->dest_arg).regnum;
      pCVar1 = (ConstantsList *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (pCVar1 == (ConstantsList *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        pCVar1 = (ConstantsList *)0x0;
      }
      else {
        (pCVar1->constant).type = MOJOSHADER_UNIFORM_FLOAT;
        (pCVar1->constant).index = 0;
        *(undefined8 *)&(pCVar1->constant).value = 0;
        *(undefined8 *)((long)&(pCVar1->constant).value + 8) = 0;
        pCVar1->next = ctx->constants;
        ctx->constants = pCVar1;
        ctx->constant_count = ctx->constant_count + 1;
      }
      if (pCVar1 != (ConstantsList *)0x0) {
        (pCVar1->constant).index = regnum;
        (pCVar1->constant).type = MOJOSHADER_UNIFORM_BOOL;
        *(uint *)&(pCVar1->constant).value = (uint)(ctx->dwords[0] != 0);
        reglist_insert(ctx,&ctx->defined_registers,REG_TYPE_CONSTBOOL,regnum);
        return;
      }
      return;
    }
    pcVar2 = "DEFB token using invalid register";
  }
  else {
    pcVar2 = "DEFB token must come before any instructions";
  }
  failf(ctx,"%s",pcVar2);
  return;
}

Assistant:

static void state_DEFB(Context *ctx)
{
    const RegisterType regtype = ctx->dest_arg.regtype;
    const int regnum = ctx->dest_arg.regnum;

    // !!! FIXME: fail if same register is defined twice.

    if (ctx->instruction_count != 0)
        fail(ctx, "DEFB token must come before any instructions");
    else if (regtype != REG_TYPE_CONSTBOOL)
        fail(ctx, "DEFB token using invalid register");
    else
    {
        ConstantsList *item = alloc_constant_listitem(ctx);
        if (item != NULL)
        {
            item->constant.index = regnum;
            item->constant.type = MOJOSHADER_UNIFORM_BOOL;
            item->constant.value.b = ctx->dwords[0] ? 1 : 0;
            set_defined_register(ctx, regtype, regnum);
        } // if
    } // else
}